

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O0

Aig_Man_t * Inter_ManStartOneOutput(Aig_Man_t *p,int fAddFirstPo)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_64;
  int local_60;
  int local_44;
  Aig_Obj_t *pAStack_40;
  int i;
  Aig_Obj_t *pCtrl;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fAddFirstPo_local;
  Aig_Man_t *p_local;
  
  pAStack_40 = (Aig_Obj_t *)0x0;
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intDup.c"
                  ,0x80,"Aig_Man_t *Inter_ManStartOneOutput(Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vCis), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_44);
    iVar1 = Saig_ManPiNum(p);
    if (local_44 == iVar1) {
      pAStack_40 = Aig_ObjCreateCi(p_00);
    }
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  if (fAddFirstPo == 0) {
    local_60 = p->nRegs;
  }
  else {
    local_60 = 0;
  }
  p_00->nRegs = local_60;
  if (fAddFirstPo == 0) {
    local_64 = p->nTruePis;
  }
  else {
    local_64 = Aig_ManCiNum(p);
  }
  local_64 = local_64 + 1;
  p_00->nTruePis = local_64;
  iVar1 = Saig_ManConstrNum(p);
  p_00->nTruePos = fAddFirstPo + iVar1;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_44);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_00,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  for (local_44 = 0; iVar1 = Saig_ManPoNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_44);
    iVar1 = Saig_ManPoNum(p);
    iVar2 = Saig_ManConstrNum(p);
    if (iVar1 - iVar2 <= local_44) {
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      pAVar4 = Aig_Not(pAVar4);
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  if (fAddFirstPo == 0) {
    for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar5 = Saig_ManLi(p,local_44);
      pAVar4 = Saig_ManLo(p,local_44);
      pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      pAVar4 = Aig_Mux(p_00,pAStack_40,pAVar4,pAVar5);
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  else {
    pAVar4 = Aig_ManCo(p,0);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Inter_ManStartOneOutput( Aig_Man_t * p, int fAddFirstPo )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pCtrl = NULL; // Suppress "might be used uninitialized"
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( i == Saig_ManPiNum(p) )
            pCtrl = Aig_ObjCreateCi( pNew );
        pObj->pData = Aig_ObjCreateCi( pNew );
    }
    // set registers
    pNew->nRegs    = fAddFirstPo? 0 : p->nRegs;
    pNew->nTruePis = fAddFirstPo? Aig_ManCiNum(p) + 1 : p->nTruePis + 1;
    pNew->nTruePos = fAddFirstPo + Saig_ManConstrNum(p);
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // create constraint outputs
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            continue;
        Aig_ObjCreateCo( pNew, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
    }

    // add the PO
    if ( fAddFirstPo )
    {
        pObj = Aig_ManCo( p, 0 );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    else
    {
        // create register inputs with MUXes
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        {
            pObj = Aig_Mux( pNew, pCtrl, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
    //        pObj = Aig_Mux( pNew, pCtrl, Aig_ManConst0(pNew), Aig_ObjChild0Copy(pObjLi) );
            Aig_ObjCreateCo( pNew, pObj );
        }
    }
    Aig_ManCleanup( pNew );
    return pNew;
}